

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::ConsoleReporter::subcase_start
          (ConsoleReporter *this,SubcaseSignature *subc)

{
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  value_type *in_stack_ffffffffffffffd8;
  vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
  *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::push_back
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI[6]._M_device =
       (mutex_type *)((long)&((in_RDI[6]._M_device)->super___mutex_base)._M_mutex + 1);
  *(undefined1 *)&in_RDI[2]._M_device = 0;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11fa8a);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& subc) override {
            std::lock_guard<std::mutex> lock(mutex);
            subcasesStack.push_back(subc);
            ++currentSubcaseLevel;
            hasLoggedCurrentTestStart = false;
        }